

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O1

void __thiscall NaLinearUnitsChain::Function(NaLinearUnitsChain *this)

{
  NaReal *in_RDX;
  NaReal *in_RSI;
  
  Function((NaLinearUnitsChain *)&this[-1].super_NaConfigPart.pSelfData,in_RSI,in_RDX);
  return;
}

Assistant:

void    NaLinearUnitsChain::Function (NaReal* x, NaReal* y)
{
    if(NULL == x || NULL == y)
        throw(na_null_pointer);

    int i;

    // Chain function computation
    memcpy(iobuf[0], x, sizeof(NaReal) * InputDim());
    for(i = 0; i < count(); ++i){
        fetch(i).Function(iobuf[i%2], iobuf[(i + 1)%2]);
    }
    memcpy(y, iobuf[i%2], sizeof(NaReal) * OutputDim());
}